

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

StringPtr kj::stringifyStackTraceAddresses(ArrayPtr<void_*const> trace,ArrayPtr<char> scratch)

{
  CappedArray<char,_17UL> *pCVar1;
  size_t sVar2;
  char *pcVar3;
  char *target;
  StringPtr SVar4;
  Delimited<kj::ArrayPtr<void_*const>_&> local_50;
  ArrayPtr<void_*const> local_20;
  
  local_20.size_ = trace.size_;
  local_20.ptr = trace.ptr;
  target = scratch.ptr;
  local_50.array = &local_20;
  local_50.delimiter.content.ptr = " ";
  local_50.delimiter.content.size_ = 2;
  local_50.stringified.ptr = (CappedArray<char,_17UL> *)0x0;
  local_50.stringified.size_ = 0;
  local_50.stringified.disposer = (ArrayDisposer *)0x0;
  pcVar3 = _::Delimited<kj::ArrayPtr<void_*const>_&>::flattenTo
                     (&local_50,target,target + (scratch.size_ - 1));
  sVar2 = local_50.stringified.size_;
  pCVar1 = local_50.stringified.ptr;
  *pcVar3 = '\0';
  if (local_50.stringified.ptr != (CappedArray<char,_17UL> *)0x0) {
    local_50.stringified.ptr = (CappedArray<char,_17UL> *)0x0;
    local_50.stringified.size_ = 0;
    (*(code *)**(undefined8 **)local_50.stringified.disposer)
              (local_50.stringified.disposer,pCVar1,0x20,sVar2,sVar2,0);
  }
  SVar4.content.size_ = (size_t)(pcVar3 + (1 - (long)target));
  SVar4.content.ptr = target;
  return (StringPtr)SVar4.content;
}

Assistant:

StringPtr stringifyStackTraceAddresses(ArrayPtr<void* const> trace, ArrayPtr<char> scratch) {
  // Version which writes into a pre-allocated buffer. This is safe for signal handlers to the
  // extent that dladdr() is safe.
  //
  // TODO(cleanup): We should improve the KJ stringification framework so that there's a way to
  //   write this string directly into a larger message buffer with strPreallocated().

#if KJ_HAS_LIBDL
  char* ptr = scratch.begin();
  char* limit = scratch.end() - 1;

  for (auto addr: trace) {
    Dl_info info;
    // Shared libraries are mapped near the end of the address space while the executable is mapped
    // near the beginning. We want to print addresses in the executable as raw addresses, not
    // offsets, since that's what addr2line expects for executables. For shared libraries it
    // expects offsets. In any case, most frames are likely to be in the main executable so it
    // makes the output cleaner if we don't repeatedly write its name.
    if (reinterpret_cast<uintptr_t>(addr) >= 0x400000000000ull && dladdr(addr, &info)) {
      uintptr_t offset = reinterpret_cast<uintptr_t>(addr) -
                         reinterpret_cast<uintptr_t>(info.dli_fbase);
      ptr = _::fillLimited(ptr, limit, kj::StringPtr(info.dli_fname), "@0x"_kj, hex(offset));
    } else {
      ptr = _::fillLimited(ptr, limit, toCharSequence(addr));
    }

    ptr = _::fillLimited(ptr, limit, " "_kj);
  }
  *ptr = '\0';
  return StringPtr(scratch.begin(), ptr);
#else
  // TODO(someday): Support other platforms.
  return kj::strPreallocated(scratch, kj::delimited(trace, " "));
#endif
}